

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepFrameBuffer.cpp
# Opt level: O3

DeepSlice * __thiscall Imf_3_4::DeepFrameBuffer::findSlice(DeepFrameBuffer *this,string *name)

{
  iterator iVar1;
  _Base_ptr p_Var2;
  key_type local_110;
  
  strncpy(local_110._text,(name->_M_dataplus)._M_p,0xff);
  local_110._text[0xff] = '\0';
  iVar1 = std::
          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
          ::find((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                  *)this,&local_110);
  p_Var2 = (_Base_ptr)0x0;
  if ((_Rb_tree_header *)iVar1._M_node != &(this->_map)._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = iVar1._M_node + 9;
  }
  return (DeepSlice *)p_Var2;
}

Assistant:

DeepSlice*
DeepFrameBuffer::findSlice (const string& name)
{
    return findSlice (name.c_str ());
}